

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_traits.hpp
# Opt level: O0

float_format
jsoncons::decode_traits<(anonymous_namespace)::ns::float_format,wchar_t,void>::
decode<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<wchar_t>>,std::allocator<char>>
          (basic_staj_cursor<wchar_t> *cursor,
          json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_>,_std::allocator<char>_>
          *decoder,error_code *ec)

{
  error_code ec_00;
  error_code ec_01;
  bool bVar1;
  type tVar2;
  undefined8 uVar3;
  error_category *peVar4;
  ser_error *this;
  size_t column;
  long *plVar5;
  long *plVar6;
  error_code *in_RDX;
  json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_>,_std::allocator<char>_>
  *in_RSI;
  long *in_RDI;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined8 in_stack_ffffffffffffff58;
  conv_errc __e;
  error_code *in_stack_ffffffffffffff60;
  size_t in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  ser_error *in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  error_category *in_stack_ffffffffffffff90;
  json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_>,_std::allocator<char>_>
  *in_stack_ffffffffffffffa8;
  
  __e = (conv_errc)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_>,_std::allocator<char>_>
  ::reset((json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_>,_std::allocator<char>_>
           *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  (**(code **)(*in_RDI + 0x30))(in_RDI,in_RSI,in_RDX);
  bVar1 = std::error_code::operator_cast_to_bool(in_RDX);
  if (bVar1) {
    uVar3 = __cxa_allocate_exception(0x58);
    plVar5 = (long *)(**(code **)(*in_RDI + 0x48))();
    peVar4 = (error_category *)(**(code **)(*plVar5 + 0x10))();
    plVar5 = (long *)(**(code **)(*in_RDI + 0x48))();
    this = (ser_error *)(**(code **)(*plVar5 + 0x18))();
    ec_00._M_cat = peVar4;
    ec_00._0_8_ = plVar5;
    ser_error::ser_error(this,ec_00,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    __cxa_throw(uVar3,&ser_error::typeinfo,ser_error::~ser_error);
  }
  bVar1 = json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_>,_std::allocator<char>_>
          ::is_valid(in_RSI);
  if (!bVar1) {
    column = __cxa_allocate_exception(0x58);
    std::error_code::error_code<jsoncons::conv_errc,void>(in_stack_ffffffffffffff60,__e);
    plVar5 = (long *)(**(code **)(*in_RDI + 0x48))();
    (**(code **)(*plVar5 + 0x10))();
    plVar6 = (long *)(**(code **)(*in_RDI + 0x48))();
    (**(code **)(*plVar6 + 0x18))();
    ec_01._M_cat = in_stack_ffffffffffffff90;
    ec_01._0_8_ = in_stack_ffffffffffffff88;
    ser_error::ser_error(in_stack_ffffffffffffff80,ec_01,(size_t)plVar5,column);
    __cxa_throw(column,&ser_error::typeinfo,ser_error::~ser_error);
  }
  json_decoder<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_>,_std::allocator<char>_>
  ::get_result(in_stack_ffffffffffffffa8);
  tVar2 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_>::
          as<(anonymous_namespace)::ns::float_format>
                    ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *)
                     CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_>::~basic_json
            ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<wchar_t>_> *)0xc71355);
  return tVar2;
}

Assistant:

static T decode(basic_staj_cursor<CharT>& cursor, 
            json_decoder<Json,TempAllocator>& decoder, 
            std::error_code& ec)
        {
            decoder.reset();
            cursor.read_to(decoder, ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                JSONCONS_THROW(ser_error(ec, cursor.context().line(), cursor.context().column()));
            }
            else if (!decoder.is_valid())
            {
                JSONCONS_THROW(ser_error(conv_errc::conversion_failed, cursor.context().line(), cursor.context().column()));
            }
            return decoder.get_result().template as<T>();
        }